

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionRTQF.cpp
# Opt level: O2

void __thiscall RTFusionRTQF::reset(RTFusionRTQF *this)

{
  RTVector3 *pRVar1;
  RTVector3 local_24;
  
  (this->super_RTFusion).m_firstTime = true;
  RTVector3::RTVector3(&local_24);
  pRVar1 = &(this->super_RTFusion).m_fusionPose;
  RTVector3::operator=(pRVar1,&local_24);
  RTQuaternion::fromEuler(&(this->super_RTFusion).m_fusionQPose,pRVar1);
  RTVector3::RTVector3(&local_24);
  RTVector3::operator=(&this->m_gyro,&local_24);
  RTVector3::RTVector3(&local_24);
  RTVector3::operator=(&(this->super_RTFusion).m_accel,&local_24);
  RTVector3::RTVector3(&local_24);
  RTVector3::operator=(&(this->super_RTFusion).m_compass,&local_24);
  RTVector3::RTVector3(&local_24);
  pRVar1 = &(this->super_RTFusion).m_measuredPose;
  RTVector3::operator=(pRVar1,&local_24);
  RTQuaternion::fromEuler(&(this->super_RTFusion).m_measuredQPose,pRVar1);
  this->m_sampleNumber = 0;
  return;
}

Assistant:

void RTFusionRTQF::reset()
{
    m_firstTime = true;
    m_fusionPose = RTVector3();
    m_fusionQPose.fromEuler(m_fusionPose);
    m_gyro = RTVector3();
    m_accel = RTVector3();
    m_compass = RTVector3();
    m_measuredPose = RTVector3();
    m_measuredQPose.fromEuler(m_measuredPose);
    m_sampleNumber = 0;
 }